

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O0

void __thiscall kratos::SortInitialVisitor::~SortInitialVisitor(SortInitialVisitor *this)

{
  SortInitialVisitor *this_local;
  
  ~SortInitialVisitor(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

void visit(Generator* top) override {
        auto const& stmts = top->get_all_stmts();
        auto new_stmts = std::vector<std::shared_ptr<Stmt>>(stmts.begin(), stmts.end());

        // move initialize to the last
        std::stable_sort(
            new_stmts.begin(), new_stmts.end(),
            [](const auto& left, const auto& right) { return get_order(left) < get_order(right); });

        top->set_stmts(new_stmts);
    }